

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_printer_n.c
# Opt level: O2

void dump_ast_node_list(TextBuffer *buf,AstNodeList *list,int level,char *delimiter)

{
  bool bVar1;
  AstNode *node;
  PtrListIterator nodeiter__;
  PtrListIterator PStack_48;
  
  raviX_ptrlist_forward_iterator(&PStack_48,(PtrList *)list);
  node = (AstNode *)raviX_ptrlist_iter_next(&PStack_48);
  bVar1 = true;
  while (node != (AstNode *)0x0) {
    if (!bVar1) {
      printf_buf(buf,"%p%s\n",(ulong)(uint)level,",");
    }
    raviX_dump_ast_node(buf,node,level + 1);
    node = (AstNode *)raviX_ptrlist_iter_next(&PStack_48);
    bVar1 = false;
  }
  return;
}

Assistant:

static void dump_ast_node_list(TextBuffer *buf, AstNodeList *list, int level, const char *delimiter)
{
	AstNode *node;
	bool is_first = true;
	FOR_EACH_PTR(list, AstNode, node)
	{
		if (is_first)
			is_first = false;
		else if (delimiter)
			printf_buf(buf, "%p%s\n", level, delimiter);
		raviX_dump_ast_node(buf, node, level + 1);
	}
	END_FOR_EACH_PTR(node)
}